

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

void __thiscall GameBoard::handleButtonClick(GameBoard *this,int i,int j)

{
  Field *pFVar1;
  bool bVar2;
  reference this_00;
  reference ppFVar3;
  QArrayDataPointer<char16_t> local_40;
  
  this_00 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)i);
  ppFVar3 = QList<Field_*>::operator[](this_00,(long)j);
  pFVar1 = *ppFVar3;
  QAbstractButton::text();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (local_40.size != 0) {
    return;
  }
  if (this->turn_ == Player2) {
    QString::QString((QString *)&local_40,"O");
    QAbstractButton::setText((QString *)pFVar1);
  }
  else {
    if (this->turn_ != Player1) goto LAB_00107f1e;
    QString::QString((QString *)&local_40,"X");
    QAbstractButton::setText((QString *)pFVar1);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
LAB_00107f1e:
  bVar2 = winConditionSatisfied(this);
  if (bVar2) {
    gameOver(this,2 - (uint)(this->turn_ == Player1));
    beginNewGame(this);
  }
  this->turn_ = (int)(this->turn_ + Player2) % 2;
  return;
}

Assistant:

void GameBoard::handleButtonClick(int i, int j)
{
    Field* field = grid_[i][j];
    if(field->text().length() != 0) //There is already an X or an O
        return;

    if(turn_ == Turn::Player1)
        field->setText("X");
    else if(turn_ == Turn::Player2)
        field->setText("O");

    if(winConditionSatisfied())
    {
       if(turn_ == Turn::Player1)
           emit gameOver(1);
       else
           emit gameOver(2);
       beginNewGame();
    }

    turn_ = static_cast<Turn>((static_cast<int>(turn_) + 1) % 2);

}